

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool ra_overwrite(roaring_array_t *source,roaring_array_t *dest,_Bool copy_on_write)

{
  _Bool _Var1;
  container_t *pcVar2;
  int local_30;
  int local_2c;
  int32_t j;
  int32_t i_1;
  int32_t i;
  _Bool copy_on_write_local;
  roaring_array_t *dest_local;
  roaring_array_t *source_local;
  
  ra_clear_containers(dest);
  if (source->size == 0) {
    dest->size = 0;
    source_local._7_1_ = true;
  }
  else if ((source->size <= dest->allocation_size) ||
          (_Var1 = realloc_array(dest,source->size), _Var1)) {
    dest->size = source->size;
    memcpy(dest->keys,source->keys,(long)dest->size << 1);
    if (copy_on_write) {
      for (j = 0; j < dest->size; j = j + 1) {
        pcVar2 = get_copy_of_container(source->containers[j],source->typecodes + j,copy_on_write);
        source->containers[j] = pcVar2;
      }
      memcpy(dest->containers,source->containers,(long)dest->size << 3);
      memcpy(dest->typecodes,source->typecodes,(long)dest->size);
    }
    else {
      memcpy(dest->typecodes,source->typecodes,(long)dest->size);
      for (local_2c = 0; local_2c < dest->size; local_2c = local_2c + 1) {
        pcVar2 = container_clone(source->containers[local_2c],source->typecodes[local_2c]);
        dest->containers[local_2c] = pcVar2;
        if (dest->containers[local_2c] == (void *)0x0) {
          for (local_30 = 0; local_30 < local_2c; local_30 = local_30 + 1) {
            container_free(dest->containers[local_30],dest->typecodes[local_30]);
          }
          ra_clear_without_containers(dest);
          return false;
        }
      }
    }
    source_local._7_1_ = true;
  }
  else {
    source_local._7_1_ = false;
  }
  return source_local._7_1_;
}

Assistant:

bool ra_overwrite(const roaring_array_t *source, roaring_array_t *dest,
                  bool copy_on_write) {
    ra_clear_containers(dest);  // we are going to overwrite them
    if (source->size == 0) {  // Note: can't call memcpy(NULL), even w/size
        dest->size = 0; // <--- This is important.
        return true;  // output was just cleared, so they match
    }
    if (dest->allocation_size < source->size) {
        if (!realloc_array(dest, source->size)) {
            return false;
        }
    }
    dest->size = source->size;
    memcpy(dest->keys, source->keys, dest->size * sizeof(uint16_t));
    // we go through the containers, turning them into shared containers...
    if (copy_on_write) {
        for (int32_t i = 0; i < dest->size; ++i) {
            source->containers[i] = get_copy_of_container(
                source->containers[i], &source->typecodes[i], copy_on_write);
        }
        // we do a shallow copy to the other bitmap
        memcpy(dest->containers, source->containers,
               dest->size * sizeof(container_t *));
        memcpy(dest->typecodes, source->typecodes,
               dest->size * sizeof(uint8_t));
    } else {
        memcpy(dest->typecodes, source->typecodes,
               dest->size * sizeof(uint8_t));
        for (int32_t i = 0; i < dest->size; i++) {
            dest->containers[i] =
                container_clone(source->containers[i], source->typecodes[i]);
            if (dest->containers[i] == NULL) {
                for (int32_t j = 0; j < i; j++) {
                    container_free(dest->containers[j], dest->typecodes[j]);
                }
                ra_clear_without_containers(dest);
                return false;
            }
        }
    }
    return true;
}